

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateCodingSynapse.cpp
# Opt level: O0

void __thiscall
RateCodingSynapse::RateCodingSynapse(RateCodingSynapse *this,Population *n_from,Population *n_to)

{
  RateCodingSynapse_param *this_00;
  Synapse *in_RDI;
  Population *in_stack_00000058;
  RateCodingSynapse *in_stack_00000060;
  
  Synapse::Synapse(in_RDI);
  in_RDI->_vptr_Synapse = (_func_int **)&PTR_update_0019ccd0;
  this_00 = (RateCodingSynapse_param *)operator_new(8);
  RateCodingSynapse_param::RateCodingSynapse_param(this_00);
  in_RDI[1]._vptr_Synapse = (_func_int **)this_00;
  std::
  vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
            *)0x1734a5);
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            ((vector<Event_*,_std::allocator<Event_*>_> *)0x1734b8);
  *(undefined1 *)&in_RDI[4].from_population = 0;
  initialize(in_stack_00000060,in_stack_00000058,(Population *)this);
  return;
}

Assistant:

RateCodingSynapse::RateCodingSynapse(Population* n_from, Population* n_to) : 
    param(new RateCodingSynapse_param)
{
    initialize(n_from, n_to);
}